

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>
    ::~AdapterPromiseNode
              ((AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>
                *)pointer);
    operator_delete(pointer,0x1b0);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }